

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpix_manager.c
# Opt level: O2

int write_tpix(int coff,opj_codestream_info_t cstr_info,int j2klen,opj_cio_t *cio)

{
  int pos;
  int pos_00;
  long lVar1;
  int j2klen_00;
  opj_codestream_info_t *poVar2;
  double *pdVar3;
  byte bVar4;
  opj_codestream_info_t in_stack_ffffffffffffff68;
  
  bVar4 = 0;
  pos = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x74706978,4);
  poVar2 = &cstr_info;
  pdVar3 = (double *)&stack0xffffffffffffff68;
  for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar3 = poVar2->D_max;
    poVar2 = (opj_codestream_info_t *)((long)poVar2 + (ulong)bVar4 * -0x10 + 8);
    pdVar3 = pdVar3 + (ulong)bVar4 * -2 + 1;
  }
  write_tpixfaix(coff,0,in_stack_ffffffffffffff68,j2klen_00,cio);
  pos_00 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(long)(pos_00 - pos),4);
  cio_seek(cio,pos_00);
  return pos_00 - pos;
}

Assistant:

int write_tpix( int coff, opj_codestream_info_t cstr_info, int j2klen, opj_cio_t *cio)
{
  int len, lenp;
  lenp = cio_tell( cio);
  cio_skip( cio, 4);              /* L [at the end] */
  cio_write( cio, JPIP_TPIX, 4);  /* TPIX           */
  
  write_tpixfaix( coff, 0, cstr_info, j2klen, cio);

  len = cio_tell( cio)-lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);        /* L              */
  cio_seek( cio, lenp+len);

  return len;
}